

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# face_from_indices.h
# Opt level: O2

Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
* __thiscall
Gudhi::coxeter_triangulation::
face_from_indices<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,std::allocator<int>>,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           *__return_storage_ptr__,coxeter_triangulation *this,
          Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *simplex,vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  OrderedSetPartition *this_00;
  int *piVar1;
  long lVar2;
  part_index *ppVar3;
  pointer pvVar4;
  pointer piVar5;
  uint uVar6;
  size_t l;
  long lVar7;
  part_index pVar8;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *pPVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *part;
  part_index *ppVar10;
  pointer pvVar11;
  part_index pVar12;
  ulong uVar13;
  ulong uVar14;
  size_type __new_size;
  part_index j;
  coxeter_triangulation *local_68;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_60;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  (__return_storage_ptr__->partition_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->partition_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->partition_).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar2 = *(long *)(this + 8);
  lVar7 = *(long *)this;
  local_68 = this;
  local_60 = __return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->vertex_,(vector<int,_std::allocator<int>_> *)this);
  __new_size = (long)(simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(simplex->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
  this_00 = &__return_storage_ptr__->partition_;
  local_58 = simplex;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_00,__new_size);
  pVar12 = lVar2 - lVar7 >> 2;
  local_50 = __new_size - 1;
  local_40 = (*(long *)(local_68 + 0x20) - *(long *)(local_68 + 0x18)) / 0x18;
  uVar13 = 1;
  pPVar9 = local_58;
  local_48 = __new_size;
  while (lVar2 = local_50, uVar13 < local_48) {
    piVar5 = (pPVar9->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = uVar13;
    for (uVar14 = (ulong)(uint)piVar5[uVar13 - 1]; uVar14 < (uint)piVar5[local_38];
        uVar14 = uVar14 + 1) {
      ppVar3 = *(part_index **)(*(long *)(local_68 + 0x18) + 8 + uVar14 * 0x18);
      for (ppVar10 = *(part_index **)(*(long *)(local_68 + 0x18) + uVar14 * 0x18); ppVar10 != ppVar3
          ; ppVar10 = ppVar10 + 1) {
        j = *ppVar10;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((this_00->
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + (uVar13 - 1),&j);
      }
      piVar5 = (local_58->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar9 = local_58;
    }
    uVar13 = local_38 + 1;
  }
  for (uVar6 = (pPVar9->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_48 - 1]; uVar6 < local_40; uVar6 = uVar6 + 1)
  {
    lVar7 = (ulong)uVar6 * 0x18;
    ppVar3 = *(part_index **)(*(long *)(local_68 + 0x18) + 8 + lVar7);
    for (ppVar10 = *(part_index **)(*(long *)(local_68 + 0x18) + lVar7); ppVar10 != ppVar3;
        ppVar10 = ppVar10 + 1) {
      j = *ppVar10;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((this_00->
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar2,&j);
    }
  }
  for (uVar13 = 0; pPVar9 = local_60,
      uVar13 < (uint)*(local_58->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start; uVar13 = uVar13 + 1) {
    ppVar3 = *(part_index **)(*(long *)(local_68 + 0x18) + 8 + uVar13 * 0x18);
    for (ppVar10 = *(part_index **)(*(long *)(local_68 + 0x18) + uVar13 * 0x18); ppVar10 != ppVar3;
        ppVar10 = ppVar10 + 1) {
      j = *ppVar10;
      piVar5 = (local_60->vertex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (j == pVar12) {
        for (pVar8 = 0; pVar12 != pVar8; pVar8 = pVar8 + 1) {
          piVar1 = piVar5 + pVar8;
          *piVar1 = *piVar1 + -1;
        }
      }
      else {
        piVar1 = piVar5 + j;
        *piVar1 = *piVar1 + 1;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((this_00->
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar2,&j);
    }
  }
  pvVar4 = (local_60->partition_).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar11 = (local_60->partition_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pvVar11 != pvVar4; pvVar11 = pvVar11 + 1
      ) {
    std::
    __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return pPVar9;
}

Assistant:

Permutahedral_representation face_from_indices(const Permutahedral_representation& simplex,
                                               const Index_range& indices) {
  using range_index = typename Index_range::value_type;
  using Ordered_set_partition = typename Permutahedral_representation::OrderedSetPartition;
  using Part = typename Ordered_set_partition::value_type;
  using part_index = typename Part::value_type;
  Permutahedral_representation value;
  std::size_t d = simplex.vertex().size();
  value.vertex() = simplex.vertex();
  std::size_t k = indices.size() - 1;
  value.partition().resize(k + 1);
  std::size_t l = simplex.partition().size() - 1;
  for (std::size_t h = 1; h < k + 1; h++)
    for (range_index i = indices[h - 1]; i < indices[h]; i++)
      for (part_index j : simplex.partition()[i]) value.partition()[h - 1].push_back(j);
  for (range_index i = indices[k]; i < l + 1; i++)
    for (part_index j : simplex.partition()[i]) value.partition()[k].push_back(j);
  for (range_index i = 0; i < indices[0]; i++)
    for (part_index j : simplex.partition()[i]) {
      if (j != d)
        value.vertex()[j]++;
      else
        for (std::size_t l = 0; l < d; l++) value.vertex()[l]--;
      value.partition()[k].push_back(j);
    }
  // sort the values in each part (probably not needed)
  for (auto& part : value.partition()) std::sort(part.begin(), part.end());
  return value;
}